

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Twine.cpp
# Opt level: O2

void __thiscall llvm::Twine::printRepr(Twine *this,raw_ostream *OS)

{
  raw_ostream *prVar1;
  
  prVar1 = OS;
  raw_ostream::operator<<(OS,"(Twine ");
  printOneChildRepr((Twine *)prVar1,OS,this->LHS,this->LHSKind);
  prVar1 = OS;
  raw_ostream::operator<<(OS," ");
  printOneChildRepr((Twine *)prVar1,OS,this->RHS,this->RHSKind);
  raw_ostream::operator<<(OS,")");
  return;
}

Assistant:

void Twine::printRepr(raw_ostream &OS) const {
  OS << "(Twine ";
  printOneChildRepr(OS, LHS, getLHSKind());
  OS << " ";
  printOneChildRepr(OS, RHS, getRHSKind());
  OS << ")";
}